

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::SingleFieldGenerator::GeneratePropertyDeclaration
          (SingleFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  allocator<char> local_141;
  Printer *printer_local;
  char *local_138;
  size_type local_130;
  char local_128 [8];
  undefined8 uStack_120;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  vars;
  undefined1 local_e0 [64];
  __index_type local_a0;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  bool local_78;
  bool local_30;
  
  printer_local = printer;
  SubstitutionMap::Install(&vars,&(this->super_FieldGenerator).variables_,printer);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"comments",&local_141);
  local_e0._0_8_ = local_e0 + 0x10;
  if (local_138 == local_128) {
    local_e0._24_8_ = uStack_120;
  }
  else {
    local_e0._0_8_ = local_138;
  }
  local_e0._8_8_ = local_130;
  local_130 = 0;
  local_128[0] = '\0';
  local_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_138 = local_128;
  local_118._M_unused._M_object = operator_new(0x18);
  *(Printer ***)local_118._M_unused._0_8_ = &printer_local;
  *(SingleFieldGenerator **)((long)local_118._M_unused._0_8_ + 8) = this;
  *(code *)((long)local_118._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_100 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_108 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_e0 + 0x20),
             (function<bool_()> *)&local_118);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  local_98._M_p = (pointer)&local_88;
  local_90 = 0;
  local_88._M_local_buf[0] = '\0';
  local_78 = false;
  if (local_a0 == '\x01') {
    std::__cxx11::string::assign((char *)&local_98);
  }
  local_30 = false;
  io::Printer::Emit(printer,local_e0,1,0x8e,
                    "\n                  $comments$\n                  @property(nonatomic, readwrite) $property_type$$name$$ deprecated_attribute$;\n                "
                   );
  io::Printer::Sub::~Sub((Sub *)local_e0);
  std::__cxx11::string::~string((string *)&local_138);
  bVar1 = FieldGenerator::WantsHasProperty(&this->super_FieldGenerator);
  if (bVar1) {
    io::Printer::Emit(printer_local,0x56,
                      "\n      @property(nonatomic, readwrite) BOOL $hazzer_name$$ deprecated_attribute$;\n    "
                     );
  }
  io::Printer::Emit(printer_local,1,"\n");
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&vars);
  return;
}

Assistant:

void SingleFieldGenerator::GeneratePropertyDeclaration(
    io::Printer* printer) const {
  auto vars = variables_.Install(printer);
  printer->Emit({{"comments",
                  [&] {
                    EmitCommentsString(printer, generation_options_,
                                       descriptor_);
                  }}},
                R"objc(
                  $comments$
                  @property(nonatomic, readwrite) $property_type$$name$$ deprecated_attribute$;
                )objc");
  if (WantsHasProperty()) {
    printer->Emit(R"objc(
      @property(nonatomic, readwrite) BOOL $hazzer_name$$ deprecated_attribute$;
    )objc");
  }
  printer->Emit("\n");
}